

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O0

FT_Error af_latin_hints_apply
                   (FT_UInt glyph_index,AF_GlyphHints hints,FT_Outline *outline,
                   AF_LatinMetrics metrics)

{
  FT_Error FVar1;
  AF_LatinAxis axis;
  int dim;
  FT_Error error;
  AF_LatinMetrics metrics_local;
  FT_Outline *outline_local;
  AF_GlyphHints hints_local;
  FT_UInt glyph_index_local;
  
  axis._4_4_ = af_glyph_hints_reload(hints,outline);
  if ((axis._4_4_ == 0) &&
     (((hints->scaler_flags & 1) != 0 ||
      (axis._4_4_ = af_latin_hints_detect_features
                              (hints,metrics->axis[0].width_count,metrics->axis[0].widths,
                               AF_DIMENSION_HORZ), axis._4_4_ == 0)))) {
    if ((hints->scaler_flags & 2) == 0) {
      FVar1 = af_latin_hints_detect_features
                        (hints,metrics->axis[1].width_count,metrics->axis[1].widths,
                         AF_DIMENSION_VERT);
      if (FVar1 != 0) {
        return FVar1;
      }
      axis._4_4_ = 0;
      if ((((metrics->root).globals)->glyph_styles[glyph_index] & 0x4000) == 0) {
        af_latin_hints_compute_blue_edges(hints,metrics);
      }
    }
    for (axis._0_4_ = AF_DIMENSION_HORZ; (int)(AF_Dimension)axis < 2;
        axis._0_4_ = (AF_Dimension)axis + AF_DIMENSION_VERT) {
      if ((((AF_Dimension)axis == AF_DIMENSION_HORZ) && ((hints->scaler_flags & 1) == 0)) ||
         (((AF_Dimension)axis == AF_DIMENSION_VERT && ((hints->scaler_flags & 2) == 0)))) {
        af_latin_hint_edges(hints,(AF_Dimension)axis);
        af_glyph_hints_align_edge_points(hints,(AF_Dimension)axis);
        af_glyph_hints_align_strong_points(hints,(AF_Dimension)axis);
        af_glyph_hints_align_weak_points(hints,(AF_Dimension)axis);
      }
    }
    af_glyph_hints_save(hints,outline);
  }
  return axis._4_4_;
}

Assistant:

static FT_Error
  af_latin_hints_apply( FT_UInt          glyph_index,
                        AF_GlyphHints    hints,
                        FT_Outline*      outline,
                        AF_LatinMetrics  metrics )
  {
    FT_Error  error;
    int       dim;

    AF_LatinAxis  axis;


    error = af_glyph_hints_reload( hints, outline );
    if ( error )
      goto Exit;

    /* analyze glyph outline */
    if ( AF_HINTS_DO_HORIZONTAL( hints ) )
    {
      axis  = &metrics->axis[AF_DIMENSION_HORZ];
      error = af_latin_hints_detect_features( hints,
                                              axis->width_count,
                                              axis->widths,
                                              AF_DIMENSION_HORZ );
      if ( error )
        goto Exit;
    }

    if ( AF_HINTS_DO_VERTICAL( hints ) )
    {
      axis  = &metrics->axis[AF_DIMENSION_VERT];
      error = af_latin_hints_detect_features( hints,
                                              axis->width_count,
                                              axis->widths,
                                              AF_DIMENSION_VERT );
      if ( error )
        goto Exit;

      /* apply blue zones to base characters only */
      if ( !( metrics->root.globals->glyph_styles[glyph_index] & AF_NONBASE ) )
        af_latin_hints_compute_blue_edges( hints, metrics );
    }

    /* grid-fit the outline */
    for ( dim = 0; dim < AF_DIMENSION_MAX; dim++ )
    {
      if ( ( dim == AF_DIMENSION_HORZ && AF_HINTS_DO_HORIZONTAL( hints ) ) ||
           ( dim == AF_DIMENSION_VERT && AF_HINTS_DO_VERTICAL( hints ) )   )
      {
        af_latin_hint_edges( hints, (AF_Dimension)dim );
        af_glyph_hints_align_edge_points( hints, (AF_Dimension)dim );
        af_glyph_hints_align_strong_points( hints, (AF_Dimension)dim );
        af_glyph_hints_align_weak_points( hints, (AF_Dimension)dim );
      }
    }

    af_glyph_hints_save( hints, outline );

  Exit:
    return error;
  }